

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_path_arc_to
               (nk_draw_list *list,nk_vec2 center,float radius,float a_min,float a_max,uint segments
               )

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  nk_vec2 pos;
  float y;
  float x;
  float new_cy;
  float new_cx;
  float cy;
  float cx;
  float cos_d;
  float sin_d;
  float d_angle;
  uint i;
  uint segments_local;
  float a_max_local;
  float a_min_local;
  float radius_local;
  nk_draw_list *list_local;
  nk_vec2 center_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x26dc,
                  "void nk_draw_list_path_arc_to(struct nk_draw_list *, struct nk_vec2, float, float, float, unsigned int)"
                 );
  }
  if ((list != (nk_draw_list *)0x0) && ((radius != 0.0 || (NAN(radius))))) {
    fVar1 = (a_max - a_min) / (float)segments;
    fVar2 = nk_sin(fVar1);
    fVar1 = nk_cos(fVar1);
    fVar3 = nk_cos(a_min);
    fVar4 = nk_sin(a_min);
    new_cy = fVar4 * radius;
    new_cx = fVar3 * radius;
    for (sin_d = 0.0; (uint)sin_d <= segments; sin_d = (float)((int)sin_d + 1)) {
      list_local._0_4_ = center.x;
      list_local._4_4_ = center.y;
      pos = nk_vec2(list_local._0_4_ + new_cx,list_local._4_4_ + new_cy);
      nk_draw_list_path_line_to(list,pos);
      fVar3 = new_cy * fVar2;
      new_cy = new_cy * fVar1 + new_cx * fVar2;
      new_cx = new_cx * fVar1 + -fVar3;
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_arc_to(struct nk_draw_list *list, struct nk_vec2 center,
    float radius, float a_min, float a_max, unsigned int segments)
{
    unsigned int i = 0;
    NK_ASSERT(list);
    if (!list) return;
    if (radius == 0.0f) return;

    /*  This algorithm for arc drawing relies on these two trigonometric identities[1]:
            sin(a + b) = sin(a) * cos(b) + cos(a) * sin(b)
            cos(a + b) = cos(a) * cos(b) - sin(a) * sin(b)

        Two coordinates (x, y) of a point on a circle centered on
        the origin can be written in polar form as:
            x = r * cos(a)
            y = r * sin(a)
        where r is the radius of the circle,
            a is the angle between (x, y) and the origin.

        This allows us to rotate the coordinates around the
        origin by an angle b using the following transformation:
            x' = r * cos(a + b) = x * cos(b) - y * sin(b)
            y' = r * sin(a + b) = y * cos(b) + x * sin(b)

        [1] https://en.wikipedia.org/wiki/List_of_trigonometric_identities#Angle_sum_and_difference_identities
    */
    {const float d_angle = (a_max - a_min) / (float)segments;
    const float sin_d = (float)NK_SIN(d_angle);
    const float cos_d = (float)NK_COS(d_angle);

    float cx = (float)NK_COS(a_min) * radius;
    float cy = (float)NK_SIN(a_min) * radius;
    for(i = 0; i <= segments; ++i) {
        float new_cx, new_cy;
        const float x = center.x + cx;
        const float y = center.y + cy;
        nk_draw_list_path_line_to(list, nk_vec2(x, y));

        new_cx = cx * cos_d - cy * sin_d;
        new_cy = cy * cos_d + cx * sin_d;
        cx = new_cx;
        cy = new_cy;
    }}
}